

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Bus_ManStop(Bus_Man_t *p)

{
  Vec_Ptr_t *__ptr;
  
  __ptr = p->vFanouts;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      p->vFanouts->pArray = (void **)0x0;
      __ptr = p->vFanouts;
      if (__ptr == (Vec_Ptr_t *)0x0) goto LAB_003acdd5;
    }
    free(__ptr);
    p->vFanouts = (Vec_Ptr_t *)0x0;
  }
LAB_003acdd5:
  Vec_FltFreeP(&p->vWireCaps);
  Vec_FltFreeP(&p->vCins);
  Vec_FltFreeP(&p->vETimes);
  Vec_FltFreeP(&p->vLoads);
  Vec_FltFreeP(&p->vDepts);
  free(p);
  return;
}

Assistant:

void Bus_ManStop( Bus_Man_t * p )
{
    Vec_PtrFreeP( &p->vFanouts );
    Vec_FltFreeP( &p->vWireCaps );
    Vec_FltFreeP( &p->vCins );
    Vec_FltFreeP( &p->vETimes );
    Vec_FltFreeP( &p->vLoads );
    Vec_FltFreeP( &p->vDepts );
    ABC_FREE( p );
}